

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.h
# Opt level: O0

string * getLitString_abi_cxx11_(int n)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  ostream *poVar6;
  int in_ESI;
  string *in_RDI;
  stringstream ss;
  const_iterator it;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffda8;
  stringstream local_1f0 [16];
  ostream local_1e0 [376];
  iterator local_68;
  _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  allocator local_41;
  int local_40;
  int local_3c;
  allocator local_35;
  int local_34;
  int local_30;
  allocator local_29;
  int local_28;
  allocator local_11;
  int local_10;
  int local_c;
  
  local_10 = lit_True.x;
  local_c = in_ESI;
  iVar3 = toInt(lit_True);
  iVar1 = local_c;
  if (in_ESI == iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"true",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    local_28 = lit_False.x;
    iVar4 = toInt(lit_False);
    iVar3 = local_c;
    if (iVar1 == iVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"false",&local_29);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
    }
    else {
      local_34 = lit_True.x;
      local_30 = (int)operator~((Lit)0x2866c7);
      iVar4 = toInt((Lit)local_30);
      iVar1 = local_c;
      if (iVar3 == iVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"false",&local_35);
        std::allocator<char>::~allocator((allocator<char> *)&local_35);
      }
      else {
        local_40 = lit_False.x;
        local_3c = (int)operator~((Lit)0x28676a);
        iVar3 = toInt((Lit)local_3c);
        if (iVar1 == iVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)in_RDI,"true",&local_41);
          std::allocator<char>::~allocator((allocator<char> *)&local_41);
        }
        else {
          local_58._M_node =
               (_Base_ptr)
               std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(in_stack_fffffffffffffda8,(key_type *)0x2867fd);
          std::
          _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree_const_iterator(&local_50,&local_58);
          local_68._M_node =
               (_Base_ptr)
               std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(in_stack_fffffffffffffda8);
          std::
          _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree_const_iterator(&local_60,&local_68);
          bVar2 = std::operator!=(&local_50,&local_60);
          if (bVar2) {
            ppVar5 = std::
                     _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator->((_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)0x28686b);
            std::__cxx11::string::string((string *)in_RDI,(string *)&ppVar5->second);
          }
          else {
            std::__cxx11::stringstream::stringstream(local_1f0);
            poVar6 = std::operator<<(local_1e0,"UNKNOWN_LITERAL (");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_c);
            std::operator<<(poVar6,")");
            std::__cxx11::stringstream::str();
            std::__cxx11::stringstream::~stringstream(local_1f0);
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

inline std::string getLitString(int n) {
	if (n == toInt(lit_True)) {
		return "true";
	}
	if (n == toInt(lit_False)) {
		return "false";
	}
	if (n == toInt(~lit_True)) {
		return "false";
	}
	if (n == toInt(~lit_False)) {
		return "true";
	}
	const std::map<int, std::string>::const_iterator it = litString.find(n);
	if (it != litString.end()) {
		return it->second;
	}
	std::stringstream ss;
	ss << "UNKNOWN_LITERAL (" << n << ")";
	return ss.str();
}